

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::log_message(int stack_trace_skip,Message *message,bool with_indentation,
                        bool abort_if_fatal)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  bool bVar4;
  Verbosity VVar5;
  __int_type depth;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  thread *this;
  char *local_d8;
  char *local_b0;
  type local_71;
  reference local_70;
  Callback *p;
  iterator __end1;
  iterator __begin1;
  CallbackVec *__range1;
  Text ec;
  Text local_38;
  Text st;
  lock_guard<std::recursive_mutex> lock;
  Verbosity verbosity;
  bool abort_if_fatal_local;
  bool with_indentation_local;
  Message *message_local;
  int stack_trace_skip_local;
  
  iVar1 = message->verbosity;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&st,(mutex_type *)s_mutex);
  if (message->verbosity == -3) {
    stacktrace((loguru *)&local_38,stack_trace_skip + 2);
    bVar4 = Text::empty(&local_38);
    if ((!bVar4) && (VVar5 = current_verbosity_cutoff(), -3 < VVar5)) {
      pcVar6 = Text::c_str(&local_38);
      raw_log(-2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
              ,0x4e7,"Stack trace:\n%s",pcVar6);
    }
    get_error_context();
    bVar4 = Text::empty((Text *)&__range1);
    if ((!bVar4) && (VVar5 = current_verbosity_cutoff(), -3 < VVar5)) {
      pcVar6 = Text::c_str((Text *)&__range1);
      raw_log(-2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
              ,0x4ec,"%s",pcVar6);
    }
    Text::~Text((Text *)&__range1);
    Text::~Text(&local_38);
  }
  if (with_indentation) {
    depth = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base *)&s_stderr_indentation);
    pcVar6 = indentation(depth);
    message->indentation = pcVar6;
  }
  __stream = _stderr;
  if (iVar1 <= g_stderr_verbosity) {
    if (((g_colorlogtostderr & 1) == 0) || ((s_terminal_has_color & 1) == 0)) {
      fprintf(_stderr,"%s%s%s%s\n",message->preamble,message->indentation,message->prefix,
              message->message);
    }
    else if (iVar1 < 0) {
      pcVar6 = terminal_reset();
      if (iVar1 == -1) {
        local_d8 = terminal_yellow();
      }
      else {
        local_d8 = terminal_red();
      }
      pcVar2 = message->preamble;
      pcVar7 = message->indentation;
      pcVar8 = message->prefix;
      pcVar3 = message->message;
      pcVar10 = terminal_reset();
      fprintf(__stream,"%s%s%s%s%s%s%s\n",pcVar6,local_d8,pcVar2,pcVar7,pcVar8,pcVar3,pcVar10);
    }
    else {
      pcVar7 = terminal_reset();
      pcVar8 = terminal_dim();
      pcVar6 = message->preamble;
      pcVar2 = message->indentation;
      if (iVar1 == 0) {
        local_b0 = terminal_reset();
      }
      else {
        local_b0 = "";
      }
      pcVar3 = message->prefix;
      pcVar10 = message->message;
      pcVar9 = terminal_reset();
      fprintf(__stream,"%s%s%s%s%s%s%s%s\n",pcVar7,pcVar8,pcVar6,pcVar2,local_b0,pcVar3,pcVar10,
              pcVar9);
    }
    if (g_flush_interval_ms == 0) {
      fflush(_stderr);
    }
    else {
      s_needs_flushing = 1;
    }
  }
  __end1 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                     ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  p = (Callback *)
      std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                     *)&p), bVar4) {
    local_70 = __gnu_cxx::
               __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
               ::operator*(&__end1);
    if (iVar1 <= local_70->verbosity) {
      if (with_indentation) {
        pcVar6 = indentation(local_70->indentation);
        message->indentation = pcVar6;
      }
      (*local_70->callback)(local_70->user_data,message);
      if (g_flush_interval_ms == 0) {
        if (local_70->flush != (flush_handler_t)0x0) {
          (*local_70->flush)(local_70->user_data);
        }
      }
      else {
        s_needs_flushing = 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
    ::operator++(&__end1);
  }
  if ((g_flush_interval_ms != 0) && (s_flush_thread == (thread *)0x0)) {
    this = (thread *)operator_new(8);
    std::thread::thread<loguru::log_message(int,loguru::Message&,bool,bool)::__0,,void>
              (this,&local_71);
    s_flush_thread = this;
  }
  if (message->verbosity == -3) {
    flush();
    if (s_fatal_handler != (code *)0x0) {
      (*s_fatal_handler)(message);
      flush();
    }
    if (abort_if_fatal) {
      if ((s_signal_options._1_1_ & 1) != 0) {
        signal(6,(__sighandler_t)0x0);
      }
      abort();
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&st);
  return;
}

Assistant:

static void log_message(int stack_trace_skip, Message& message, bool with_indentation, bool abort_if_fatal)
	{
		const auto verbosity = message.verbosity;
		std::lock_guard<std::recursive_mutex> lock(s_mutex);

		if (message.verbosity == Verbosity_FATAL) {
			auto st = loguru::stacktrace(stack_trace_skip + 2);
			if (!st.empty()) {
				RAW_LOG_F(ERROR, "Stack trace:\n" LOGURU_FMT(s) "", st.c_str());
			}

			auto ec = loguru::get_error_context();
			if (!ec.empty()) {
				RAW_LOG_F(ERROR, "" LOGURU_FMT(s) "", ec.c_str());
			}
		}

		if (with_indentation) {
			message.indentation = indentation(s_stderr_indentation);
		}

		if (verbosity <= g_stderr_verbosity) {
			if (g_colorlogtostderr && s_terminal_has_color) {
				if (verbosity > Verbosity_WARNING) {
					fprintf(stderr, "%s%s%s%s%s%s%s%s\n",
						terminal_reset(),
						terminal_dim(),
						message.preamble,
						message.indentation,
						verbosity == Verbosity_INFO ? terminal_reset() : "", // un-dim for info
						message.prefix,
						message.message,
						terminal_reset());
				} else {
					fprintf(stderr, "%s%s%s%s%s%s%s\n",
						terminal_reset(),
						verbosity == Verbosity_WARNING ? terminal_yellow() : terminal_red(),
						message.preamble,
						message.indentation,
						message.prefix,
						message.message,
						terminal_reset());
				}
			} else {
				fprintf(stderr, "%s%s%s%s\n",
					message.preamble, message.indentation, message.prefix, message.message);
			}

			if (g_flush_interval_ms == 0) {
				fflush(stderr);
			} else {
				s_needs_flushing = true;
			}
		}

		for (auto& p : s_callbacks) {
			if (verbosity <= p.verbosity) {
				if (with_indentation) {
					message.indentation = indentation(p.indentation);
				}
				p.callback(p.user_data, message);
				if (g_flush_interval_ms == 0) {
					if (p.flush) { p.flush(p.user_data); }
				} else {
					s_needs_flushing = true;
				}
			}
		}

		if (g_flush_interval_ms > 0 && !s_flush_thread) {
			s_flush_thread = new std::thread([](){
				for (;;) {
					if (s_needs_flushing) {
						flush();
					}
					std::this_thread::sleep_for(std::chrono::milliseconds(g_flush_interval_ms));
				}
			});
		}

		if (message.verbosity == Verbosity_FATAL) {
			flush();

			if (s_fatal_handler) {
				s_fatal_handler(message);
				flush();
			}

			if (abort_if_fatal) {
#if !defined(_WIN32)
				if (s_signal_options.sigabrt) {
					// Make sure we don't catch our own abort:
					signal(SIGABRT, SIG_DFL);
				}
#endif
				abort();
			}
		}
	}